

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cpp
# Opt level: O0

void duckdb_brotli::BrotliSplitBlock
               (MemoryManager *m,Command *cmds,size_t num_commands,uint8_t *data,size_t pos,
               size_t mask,BrotliEncoderParams *params,BlockSplit *literal_split,
               BlockSplit *insert_and_copy_split,BlockSplit *dist_split)

{
  size_t sVar1;
  uint8_t *literals_00;
  ulong in_RDX;
  Command *in_RSI;
  long lVar2;
  void *in_stack_00000008;
  MemoryManager *in_stack_00000010;
  MemoryManager *in_stack_00000018;
  MemoryManager *in_stack_00000020;
  Command *cmd;
  size_t i_1;
  size_t j;
  uint16_t *distance_prefixes;
  size_t i;
  uint16_t *insert_and_copy_codes;
  uint8_t *literals;
  size_t literals_count;
  size_t in_stack_ffffffffffffff58;
  void *pvVar3;
  MemoryManager *in_stack_ffffffffffffff60;
  void *local_90;
  void *local_88;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  uint8_t *in_stack_ffffffffffffff98;
  long lVar4;
  size_t in_stack_ffffffffffffffa0;
  Command *in_stack_ffffffffffffffa8;
  ulong uVar5;
  
  sVar1 = CountLiterals(in_RSI,in_RDX);
  if (sVar1 == 0) {
    literals_00 = (uint8_t *)0x0;
  }
  else {
    literals_00 = (uint8_t *)BrotliAllocate(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  CopyLiteralsToByteArray
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,literals_00);
  pvVar3 = in_stack_00000008;
  SplitByteVectorLiteral
            ((MemoryManager *)mask,(uint8_t *)literals_count,(size_t)literals,
             (size_t)insert_and_copy_codes,i,(size_t)distance_prefixes,(double)j,
             (BrotliEncoderParams *)data,(BlockSplit *)num_commands);
  BrotliFree(in_stack_00000010,pvVar3);
  if (in_RDX == 0) {
    local_88 = (void *)0x0;
  }
  else {
    local_88 = BrotliAllocate(in_stack_00000010,(size_t)pvVar3);
  }
  for (uVar5 = 0; uVar5 < in_RDX; uVar5 = uVar5 + 1) {
    *(uint16_t *)((long)local_88 + uVar5 * 2) = in_RSI[uVar5].cmd_prefix_;
  }
  pvVar3 = in_stack_00000008;
  SplitByteVectorCommand
            ((MemoryManager *)mask,(uint16_t *)literals_count,(size_t)literals,
             (size_t)insert_and_copy_codes,i,(size_t)distance_prefixes,(double)j,
             (BrotliEncoderParams *)data,(BlockSplit *)num_commands);
  BrotliFree(in_stack_00000018,pvVar3);
  if (in_RDX == 0) {
    local_90 = (void *)0x0;
  }
  else {
    local_90 = BrotliAllocate(in_stack_00000018,(size_t)pvVar3);
  }
  lVar4 = 0;
  for (uVar5 = 0; uVar5 < in_RDX; uVar5 = uVar5 + 1) {
    lVar2 = lVar4;
    if (((in_RSI[uVar5].copy_len_ & 0x1ffffff) != 0) && (0x7f < in_RSI[uVar5].cmd_prefix_)) {
      lVar2 = lVar4 + 1;
      *(uint16_t *)((long)local_90 + lVar4 * 2) = in_RSI[uVar5].dist_prefix_ & 0x3ff;
    }
    lVar4 = lVar2;
  }
  SplitByteVectorDistance
            ((MemoryManager *)mask,(uint16_t *)literals_count,(size_t)literals,
             (size_t)insert_and_copy_codes,i,(size_t)distance_prefixes,(double)j,
             (BrotliEncoderParams *)data,(BlockSplit *)num_commands);
  BrotliFree(in_stack_00000020,in_stack_00000008);
  return;
}

Assistant:

void duckdb_brotli::BrotliSplitBlock(MemoryManager* m,
                      const Command* cmds,
                      const size_t num_commands,
                      const uint8_t* data,
                      const size_t pos,
                      const size_t mask,
                      const BrotliEncoderParams* params,
                      BlockSplit* literal_split,
                      BlockSplit* insert_and_copy_split,
                      BlockSplit* dist_split) {
  {
    size_t literals_count = CountLiterals(cmds, num_commands);
    uint8_t* literals = BROTLI_ALLOC(m, uint8_t, literals_count);
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(literals)) return;
    /* Create a continuous array of literals. */
    CopyLiteralsToByteArray(cmds, num_commands, data, pos, mask, literals);
    /* Create the block split on the array of literals.
     * Literal histograms can have alphabet size up to 256.
     * Though, to accomodate context modeling, less than half of maximum size
     * is allowed. */
    SplitByteVectorLiteral(
        m, literals, literals_count,
        kSymbolsPerLiteralHistogram, kMaxLiteralHistograms,
        kLiteralStrideLength, kLiteralBlockSwitchCost, params,
        literal_split);
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, literals);
    /* NB: this might be a good place for injecting extra splitting without
     *     increasing encoder complexity; however, output parition would be less
     *     optimal than one produced with forced splitting inside
     *     SplitByteVector (FindBlocks / ClusterBlocks). */
  }

  {
    /* Compute prefix codes for commands. */
    uint16_t* insert_and_copy_codes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(insert_and_copy_codes)) return;
    for (i = 0; i < num_commands; ++i) {
      insert_and_copy_codes[i] = cmds[i].cmd_prefix_;
    }
    /* Create the block split on the array of command prefixes. */
    SplitByteVectorCommand(
        m, insert_and_copy_codes, num_commands,
        kSymbolsPerCommandHistogram, kMaxCommandHistograms,
        kCommandStrideLength, kCommandBlockSwitchCost, params,
        insert_and_copy_split);
    if (BROTLI_IS_OOM(m)) return;
    /* TODO(eustas): reuse for distances? */
    BROTLI_FREE(m, insert_and_copy_codes);
  }

  {
    /* Create a continuous array of distance prefixes. */
    uint16_t* distance_prefixes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t j = 0;
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(distance_prefixes)) return;
    for (i = 0; i < num_commands; ++i) {
      const Command* cmd = &cmds[i];
      if (CommandCopyLen(cmd) && cmd->cmd_prefix_ >= 128) {
        distance_prefixes[j++] = cmd->dist_prefix_ & 0x3FF;
      }
    }
    /* Create the block split on the array of distance prefixes. */
    SplitByteVectorDistance(
        m, distance_prefixes, j,
        kSymbolsPerDistanceHistogram, kMaxCommandHistograms,
        kDistanceStrideLength, kDistanceBlockSwitchCost, params,
        dist_split);
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, distance_prefixes);
  }
}